

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O0

void find_median<signed_char>
               (vector<signed_char,_std::allocator<signed_char>_> *numbers,VectorData *vd)

{
  char cVar1;
  size_type sVar2;
  const_reference pvVar3;
  iterator __first;
  iterator __last;
  ulong __n;
  double lower;
  double upper;
  size_t pos;
  undefined1 local_30 [8];
  vector<signed_char,_std::allocator<signed_char>_> numbers_copy;
  VectorData *vd_local;
  vector<signed_char,_std::allocator<signed_char>_> *numbers_local;
  
  numbers_copy.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)vd;
  sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size(numbers);
  if (sVar2 == 1) {
    pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::at(numbers,0);
    *(double *)
     (numbers_copy.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage + 0x18) = (double)(int)*pvVar3;
  }
  else {
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)local_30,numbers);
    __first = std::vector<signed_char,_std::allocator<signed_char>_>::begin
                        ((vector<signed_char,_std::allocator<signed_char>_> *)local_30);
    __last = std::vector<signed_char,_std::allocator<signed_char>_>::end
                       ((vector<signed_char,_std::allocator<signed_char>_> *)local_30);
    std::
    sort<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>>
              ((__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                )__first._M_current,
               (__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                )__last._M_current);
    sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size(numbers);
    __n = sVar2 >> 1;
    pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::at(numbers,__n);
    *(double *)
     (numbers_copy.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage + 0x18) = (double)(int)*pvVar3;
    sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size(numbers);
    if ((sVar2 & 1) == 0) {
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::at(numbers,__n);
      cVar1 = *pvVar3;
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::at(numbers,__n - 1);
      *(double *)
       (numbers_copy.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage + 0x18) =
           ((double)(int)cVar1 + (double)(int)*pvVar3) / 2.0;
    }
    std::vector<signed_char,_std::allocator<signed_char>_>::~vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)local_30);
  }
  return;
}

Assistant:

void find_median(const std::vector<Number>& numbers,
	VectorData& vd)
{
	if (numbers.size() == 1)
	{
		vd.median = numbers.at(0);
		return;
	}

	std::vector<Number> numbers_copy(numbers);
	std::sort(numbers_copy.begin(), numbers_copy.end());

	size_t pos = numbers.size() / 2;
	vd.median = numbers.at(pos);

	if (numbers.size() % 2 == 0)
	{
		double upper = numbers.at(pos);
		double lower = numbers.at(pos - 1);
		vd.median = (upper + lower) / 2.0;
	}
}